

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

int Abc_NodeTravId(Abc_Obj_t *p)

{
  int iVar1;
  int in_EDX;
  Vec_Int_t *p_00;
  
  p_00 = &p->pNtk->vTravIds;
  iVar1 = p->Id;
  Vec_IntFillExtra(p_00,iVar1 + 1,in_EDX);
  iVar1 = Vec_IntEntry(p_00,iVar1);
  return iVar1;
}

Assistant:

static inline int         Abc_NodeTravId( Abc_Obj_t * p )                   { return Vec_IntGetEntry(&Abc_ObjNtk(p)->vTravIds, Abc_ObjId(p));                       }